

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_CheckInventory(FParser *this)

{
  AActor *activator;
  uint uVar1;
  int iVar2;
  char *type;
  
  if (1 < this->t_argc) {
    uVar1 = T_GetPlayerNum(this->t_argv);
    if (uVar1 == 0xffffffff) {
      (this->t_return).value.i = 0;
    }
    else {
      (this->t_return).type = 1;
      activator = (AActor *)(&players)[(ulong)uVar1 * 0x54];
      type = stringvalue(this->t_argv + 1);
      iVar2 = FS_CheckInventory(activator,type);
      (this->t_return).value.i = iVar2;
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_CheckInventory(void)
{
	int  playernum;
	
	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) 
		{
			t_return.value.i = 0;
			return;
		}
		t_return.type = svt_int;
		t_return.value.i = FS_CheckInventory(players[playernum].mo, stringvalue(t_argv[1]));
	}
}